

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_format gl4cts::TextureViewUtilities::getFormatOfInternalformat(GLenum internalformat)

{
  TestError *this;
  _format local_10;
  _format result;
  GLenum internalformat_local;
  
  if ((((internalformat == 0x8051) || (internalformat == 0x8054)) || (internalformat - 0x8056 < 4))
     || (internalformat == 0x805b)) {
LAB_01129992:
    local_10 = FORMAT_UNORM;
  }
  else {
    if (1 < internalformat - 0x81a5) {
      if (internalformat - 0x8229 < 4) goto LAB_01129992;
      if (3 < internalformat - 0x822d) {
        if (internalformat == 0x8231) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x8232) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (internalformat == 0x8233) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x8234) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (internalformat == 0x8235) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x8236) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (internalformat == 0x8237) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x8238) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (internalformat == 0x8239) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x823a) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (internalformat == 0x823b) {
          return FORMAT_SIGNED_INTEGER;
        }
        if (internalformat == 0x823c) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        if (((1 < internalformat - 0x8814) && (1 < internalformat - 0x881a)) &&
           (internalformat != 0x8c3a)) {
          if (internalformat == 0x8c3d) {
            return FORMAT_RGBE;
          }
          if ((internalformat != 0x8c41) && (internalformat != 0x8c43)) {
            if (internalformat == 0x8cac) goto LAB_011299bc;
            if (internalformat != 0x8d62) {
              if (internalformat - 0x8d70 < 2) {
                return FORMAT_UNSIGNED_INTEGER;
              }
              if (internalformat - 0x8d76 < 2) {
                return FORMAT_UNSIGNED_INTEGER;
              }
              if (internalformat - 0x8d7c < 2) {
                return FORMAT_UNSIGNED_INTEGER;
              }
              if (internalformat - 0x8d82 < 2) {
                return FORMAT_SIGNED_INTEGER;
              }
              if (internalformat - 0x8d88 < 2) {
                return FORMAT_SIGNED_INTEGER;
              }
              if (internalformat - 0x8d8e < 2) {
                return FORMAT_SIGNED_INTEGER;
              }
              if (internalformat != 0x8dbb) {
                if (internalformat == 0x8dbc) {
                  return FORMAT_SNORM;
                }
                if (internalformat != 0x8dbd) {
                  if (internalformat == 0x8dbe) {
                    return FORMAT_SNORM;
                  }
                  if (1 < internalformat - 0x8e8c) {
                    if (1 < internalformat - 0x8e8e) {
                      if (internalformat - 0x8f94 < 8) {
                        return FORMAT_SNORM;
                      }
                      if (internalformat == 0x906f) {
                        return FORMAT_UNSIGNED_INTEGER;
                      }
                      this = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (this,"Unrecognized internalformat",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                                 ,0x364);
                      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                    }
                    goto LAB_011299bc;
                  }
                }
              }
            }
          }
          goto LAB_01129992;
        }
      }
    }
LAB_011299bc:
    local_10 = FORMAT_FLOAT;
  }
  return local_10;
}

Assistant:

_format TextureViewUtilities::getFormatOfInternalformat(const glw::GLenum internalformat)
{
	_format result = FORMAT_UNDEFINED;

	switch (internalformat)
	{
	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_RED_RGTC1:
	case GL_RGBA16:
	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGB16:
	case GL_RGB5_A1:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RG16:
	case GL_RG8:
	case GL_R16:
	case GL_R8:
	case GL_SRGB8:
	case GL_SRGB8_ALPHA8:
	{
		result = FORMAT_UNORM;

		break;
	}

	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_RGBA16_SNORM:
	case GL_RGBA8_SNORM:
	case GL_RGB16_SNORM:
	case GL_RGB8_SNORM:
	case GL_RG16_SNORM:
	case GL_RG8_SNORM:
	case GL_R16_SNORM:
	case GL_R8_SNORM:
	{
		result = FORMAT_SNORM;

		break;
	}

	case GL_RGB10_A2UI:
	case GL_RGBA16UI:
	case GL_RGBA32UI:
	case GL_RGBA8UI:
	case GL_RGB16UI:
	case GL_RGB32UI:
	case GL_RGB8UI:
	case GL_RG16UI:
	case GL_RG32UI:
	case GL_RG8UI:
	case GL_R16UI:
	case GL_R32UI:
	case GL_R8UI:
	{
		result = FORMAT_UNSIGNED_INTEGER;

		break;
	}

	case GL_RGB9_E5:
	{
		result = FORMAT_RGBE;

		break;
	}

	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32F:
	case GL_R11F_G11F_B10F:
	case GL_RGBA16F:
	case GL_RGBA32F:
	case GL_RGB16F:
	case GL_RGB32F:
	case GL_RG16F:
	case GL_RG32F:
	case GL_R16F:
	case GL_R32F:
	{
		result = FORMAT_FLOAT;

		break;
	}

	case GL_RGBA16I:
	case GL_RGBA32I:
	case GL_RGBA8I:
	case GL_RGB16I:
	case GL_RGB32I:
	case GL_RGB8I:
	case GL_RG16I:
	case GL_RG32I:
	case GL_RG8I:
	case GL_R16I:
	case GL_R32I:
	case GL_R8I:
	{
		result = FORMAT_SIGNED_INTEGER;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}